

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O3

int Nwk_ManPushForwardTop_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  iVar3 = pObj->TravId;
  iVar1 = pObj->pMan->nTravIds;
  if (iVar3 == iVar1 || iVar1 + -1 == iVar3) {
    return 0;
  }
  iVar2 = iVar1 + -1;
  if ((iVar1 + -2 <= iVar3) && (iVar2 = iVar1, iVar3 != iVar1 + -2)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                  ,0x52,"void Nwk_ObjSetVisitedTop(Nwk_Obj_t *)");
  }
  pObj->TravId = iVar2;
  uVar4 = *(uint *)&pObj->field_0x20;
  if ((uVar4 & 0x10) == 0) {
    if (0 < pObj->nFanouts) {
      lVar5 = 0;
      do {
        if (pObj->pFanio[pObj->nFanins + lVar5] == (Nwk_Obj_t *)0x0) break;
        iVar3 = Nwk_ManPushForwardBot_rec(pObj->pFanio[pObj->nFanins + lVar5],pPred);
        if (iVar3 != 0) {
          return 1;
        }
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 < pObj->nFanouts);
      uVar4 = *(uint *)&pObj->field_0x20;
    }
    if ((uVar4 & 7) == 1 || (uVar4 & 0x20) == 0) {
      return 0;
    }
    iVar3 = Nwk_ManPushForwardBot_rec(pObj,(Nwk_Obj_t *)pObj->pCopy);
    if (iVar3 == 0) {
      return 0;
    }
    pObj->field_0x20 = pObj->field_0x20 & 0xdf;
    pObj->pCopy = (void *)0x0;
  }
  return 1;
}

Assistant:

int Nwk_ManPushForwardTop_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedTop(pObj) )
        return 0;
    Nwk_ObjSetVisitedTop(pObj);
    // check if this is the sink
    if ( Nwk_ObjIsSink(pObj) )
        return 1;
    // try to push through the fanouts
    Nwk_ObjForEachFanout( pObj, pNext, i )
        if ( Nwk_ManPushForwardBot_rec( pNext, pPred ) )
            return 1;
    // redirect the flow
    if ( Nwk_ObjHasFlow(pObj) && !Nwk_ObjIsCi(pObj) )
        if ( Nwk_ManPushForwardBot_rec( pObj, Nwk_ObjPred(pObj) ) )
        {
            Nwk_ObjClearFlow( pObj );
            return Nwk_ObjSetPred( pObj, NULL );
        }
    return 0;
}